

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O2

UINTN EfiDecompress(void *Source,UINT32 SrcSize,void *Destination,UINT32 DstSize,void *Scratch,
                   UINT32 ScratchSize)

{
  UINTN UVar1;
  
  UVar1 = Decompress(Source,SrcSize,Destination,DstSize,Scratch,ScratchSize,'\x01');
  return UVar1;
}

Assistant:

EFI_STATUS
EFIAPI
EfiDecompress (
    IN      CONST VOID *Source,
    IN      UINT32     SrcSize,
    IN OUT  VOID       *Destination,
    IN      UINT32     DstSize,
    IN OUT  VOID       *Scratch,
    IN      UINT32     ScratchSize
    )
{
    //
    // For EFI 1.1 de/compression algorithm, the version is 1.
    //
    return Decompress (
        Source,
        SrcSize,
        Destination,
        DstSize,
        Scratch,
        ScratchSize,
        1
        );
}